

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::maxAbsColscale(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *__return_storage_ptr__,
                SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  DataArray<int> *pDVar1;
  int iVar2;
  long lVar3;
  double dVar4;
  cpp_dec_float<100U,_int,_void> local_78;
  
  pDVar1 = this->m_activeColscaleExp;
  (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
  (__return_storage_ptr__->m_backend).prec_elem = 0x10;
  (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
  (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
  *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,0.0);
  if (0 < pDVar1->thesize) {
    lVar3 = 0;
    do {
      dVar4 = ldexp(1.0,pDVar1->data[lVar3]);
      if ((!NAN(dVar4)) && ((__return_storage_ptr__->m_backend).fpclass != cpp_dec_float_NaN)) {
        local_78.fpclass = cpp_dec_float_finite;
        local_78.prec_elem = 0x10;
        local_78.data._M_elems[0] = 0;
        local_78.data._M_elems[1] = 0;
        local_78.data._M_elems[2] = 0;
        local_78.data._M_elems[3] = 0;
        local_78.data._M_elems[4] = 0;
        local_78.data._M_elems[5] = 0;
        local_78.data._M_elems[6] = 0;
        local_78.data._M_elems[7] = 0;
        local_78.data._M_elems[8] = 0;
        local_78.data._M_elems[9] = 0;
        local_78.data._M_elems[10] = 0;
        local_78.data._M_elems[0xb] = 0;
        local_78.data._M_elems[0xc] = 0;
        local_78.data._M_elems[0xd] = 0;
        local_78.data._M_elems._56_5_ = 0;
        local_78.data._M_elems[0xf]._1_3_ = 0;
        local_78.exp = 0;
        local_78.neg = false;
        boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                  ((cpp_dec_float<100u,int,void> *)&local_78,ABS(dVar4));
        iVar2 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                          (&__return_storage_ptr__->m_backend,&local_78);
        if (iVar2 < 0) {
          dVar4 = ldexp(1.0,pDVar1->data[lVar3]);
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,ABS(dVar4));
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < pDVar1->thesize);
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::maxAbsColscale() const
{
   const DataArray < int >& colscaleExp = *m_activeColscaleExp;

   R maxi = 0.0;

   for(int i = 0; i < colscaleExp.size(); ++i)
      if(spxAbs(spxLdexp(1.0, colscaleExp[i])) > maxi)
         maxi = spxAbs(spxLdexp(1.0, colscaleExp[i]));


   return maxi;
}